

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TTSnapValues.cpp
# Opt level: O3

JavascriptPromiseCapability *
TTD::NSSnapValues::InflatePromiseCapabilityInfo
          (SnapPromiseCapabilityInfo *capabilityInfo,ScriptContext *ctx,InflateMap *inflator)

{
  BaseDictionary<unsigned_long,_void_*,_Memory::HeapAllocator,_DictionarySizePolicy<PowerOf2Policy,_2U,_2U,_1U,_4U>,_DefaultComparer,_JsUtil::SimpleDictionaryEntry,_JsUtil::NoResizeLock>
  *this;
  bool bVar1;
  Var resolve;
  Var reject;
  JavascriptPromiseCapability *pJVar2;
  JavascriptPromiseCapability *local_48;
  Var local_40;
  TTD_PTR_ID local_38;
  
  local_38 = capabilityInfo->CapabilityId;
  this = &inflator->m_promiseDataMap;
  bVar1 = JsUtil::
          BaseDictionary<unsigned_long,_void_*,_Memory::HeapAllocator,_DictionarySizePolicy<PowerOf2Policy,_2U,_2U,_1U,_4U>,_DefaultComparer,_JsUtil::SimpleDictionaryEntry,_JsUtil::NoResizeLock>
          ::ContainsKey(this,&local_38);
  if (!bVar1) {
    local_40 = InflateMap::InflateTTDVar(inflator,capabilityInfo->PromiseVar);
    resolve = InflateMap::InflateTTDVar(inflator,capabilityInfo->ResolveVar);
    reject = InflateMap::InflateTTDVar(inflator,capabilityInfo->RejectVar);
    local_48 = Js::JavascriptLibrary::CreatePromiseCapability_TTD
                         ((ctx->super_ScriptContextBase).javascriptLibrary,local_40,resolve,reject);
    local_38 = capabilityInfo->CapabilityId;
    JsUtil::
    BaseDictionary<unsigned_long,void*,Memory::HeapAllocator,DictionarySizePolicy<PowerOf2Policy,2u,2u,1u,4u>,DefaultComparer,JsUtil::SimpleDictionaryEntry,JsUtil::NoResizeLock>
    ::
    Insert<(JsUtil::BaseDictionary<unsigned_long,void*,Memory::HeapAllocator,DictionarySizePolicy<PowerOf2Policy,2u,2u,1u,4u>,DefaultComparer,JsUtil::SimpleDictionaryEntry,JsUtil::NoResizeLock>::InsertOperations)1>
              ((BaseDictionary<unsigned_long,void*,Memory::HeapAllocator,DictionarySizePolicy<PowerOf2Policy,2u,2u,1u,4u>,DefaultComparer,JsUtil::SimpleDictionaryEntry,JsUtil::NoResizeLock>
                *)this,&local_38,&local_48);
  }
  local_38 = capabilityInfo->CapabilityId;
  pJVar2 = (JavascriptPromiseCapability *)
           JsUtil::
           BaseDictionary<unsigned_long,_void_*,_Memory::HeapAllocator,_DictionarySizePolicy<PowerOf2Policy,_2U,_2U,_1U,_4U>,_DefaultComparer,_JsUtil::SimpleDictionaryEntry,_JsUtil::NoResizeLock>
           ::Item(this,&local_38);
  return pJVar2;
}

Assistant:

Js::JavascriptPromiseCapability* InflatePromiseCapabilityInfo(const SnapPromiseCapabilityInfo* capabilityInfo, Js::ScriptContext* ctx, InflateMap* inflator)
        {
            if(!inflator->IsPromiseInfoDefined<Js::JavascriptPromiseCapability>(capabilityInfo->CapabilityId))
            {
                Js::Var promise = inflator->InflateTTDVar(capabilityInfo->PromiseVar);
                Js::Var resolve = inflator->InflateTTDVar(capabilityInfo->ResolveVar);
                Js::Var reject = inflator->InflateTTDVar(capabilityInfo->RejectVar);

                Js::JavascriptPromiseCapability* res = ctx->GetLibrary()->CreatePromiseCapability_TTD(promise, resolve, reject);
                inflator->AddInflatedPromiseInfo<Js::JavascriptPromiseCapability>(capabilityInfo->CapabilityId, res);
            }

            return inflator->LookupInflatedPromiseInfo<Js::JavascriptPromiseCapability>(capabilityInfo->CapabilityId);
        }